

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsTextureStateQueryTests.cpp
# Opt level: O0

IterateResult __thiscall
deqp::gls::TextureStateQueryTests::anon_unknown_1::SamplerTest::iterate(SamplerTest *this)

{
  CallLogWrapper *this_00;
  int iVar1;
  deUint32 dVar2;
  undefined4 extraout_var;
  TestLog *pTVar3;
  undefined1 local_c8 [8];
  Sampler sampler;
  allocator<char> local_99;
  string local_98;
  undefined1 local_78 [8];
  ResultCollector result;
  CallLogWrapper gl;
  SamplerTest *this_local;
  
  iVar1 = (*this->m_renderCtx->_vptr_RenderContext[3])();
  pTVar3 = tcu::TestContext::getLog((this->super_TestCase).super_TestNode.m_testCtx);
  glu::CallLogWrapper::CallLogWrapper
            ((CallLogWrapper *)((long)&result.m_message.field_2 + 8),
             (Functions *)CONCAT44(extraout_var,iVar1),pTVar3);
  pTVar3 = tcu::TestContext::getLog((this->super_TestCase).super_TestNode.m_testCtx);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_98," // ERROR: ",&local_99);
  tcu::ResultCollector::ResultCollector((ResultCollector *)local_78,pTVar3,&local_98);
  std::__cxx11::string::~string((string *)&local_98);
  std::allocator<char>::~allocator(&local_99);
  glu::TypedObjectWrapper<(glu::ObjectType)7>::TypedObjectWrapper
            ((TypedObjectWrapper<(glu::ObjectType)7> *)local_c8,this->m_renderCtx);
  this_00 = (CallLogWrapper *)((long)&result.m_message.field_2 + 8);
  glu::CallLogWrapper::enableLogging(this_00,true);
  dVar2 = glu::ObjectWrapper::operator*((ObjectWrapper *)local_c8);
  this->m_target = dVar2;
  (*(this->super_TestCase).super_TestNode._vptr_TestNode[5])(this,this_00,local_78);
  this->m_target = 0;
  tcu::ResultCollector::setTestContextResult
            ((ResultCollector *)local_78,(this->super_TestCase).super_TestNode.m_testCtx);
  glu::TypedObjectWrapper<(glu::ObjectType)7>::~TypedObjectWrapper
            ((TypedObjectWrapper<(glu::ObjectType)7> *)local_c8);
  tcu::ResultCollector::~ResultCollector((ResultCollector *)local_78);
  glu::CallLogWrapper::~CallLogWrapper((CallLogWrapper *)((long)&result.m_message.field_2 + 8));
  return STOP;
}

Assistant:

SamplerTest::IterateResult SamplerTest::iterate (void)
{
	glu::CallLogWrapper		gl		(m_renderCtx.getFunctions(), m_testCtx.getLog());
	tcu::ResultCollector	result	(m_testCtx.getLog(), " // ERROR: ");
	glu::Sampler			sampler	(m_renderCtx);

	gl.enableLogging(true);

	m_target = *sampler;
	test(gl, result);
	m_target = 0;

	result.setTestContextResult(m_testCtx);
	return STOP;
}